

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Hash_SHA1.c
# Opt level: O0

void Hacl_Hash_SHA1_free(Hacl_Streaming_MD_state_32 *state)

{
  uint8_t *__ptr;
  uint32_t *block_state;
  uint8_t *buf;
  Hacl_Streaming_MD_state_32 scrut;
  Hacl_Streaming_MD_state_32 *state_local;
  
  __ptr = state->buf;
  free(state->block_state);
  free(__ptr);
  free(state);
  return;
}

Assistant:

void Hacl_Hash_SHA1_free(Hacl_Streaming_MD_state_32 *state)
{
  Hacl_Streaming_MD_state_32 scrut = *state;
  uint8_t *buf = scrut.buf;
  uint32_t *block_state = scrut.block_state;
  KRML_HOST_FREE(block_state);
  KRML_HOST_FREE(buf);
  KRML_HOST_FREE(state);
}